

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_leaflist(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  uint uVar1;
  lysp_node *plVar2;
  lysp_ext_instance *object;
  LY_ERR LVar3;
  lysp_node *parent;
  lysp_node **pplVar4;
  lysp_node *plVar5;
  yin_subelement subelems [14];
  yin_subelement local_178;
  undefined4 local_160;
  lysp_node *local_158;
  undefined2 local_150;
  undefined4 local_148;
  char **local_140;
  undefined2 local_138;
  undefined4 local_130;
  lysp_qname **local_128;
  undefined2 local_120;
  undefined4 local_118;
  lysp_node *local_110;
  undefined2 local_108;
  undefined4 local_100;
  lysp_node *local_f8;
  undefined2 local_f0;
  undefined4 local_e8;
  lysp_node *local_e0;
  undefined2 local_d8;
  undefined4 local_d0;
  uint16_t *local_c8;
  undefined2 local_c0;
  undefined4 local_b8;
  char **local_b0;
  undefined2 local_a8;
  undefined4 local_a0;
  uint16_t *local_98;
  undefined2 local_90;
  undefined4 local_88;
  lysp_node **local_80;
  undefined2 local_78;
  undefined4 local_70;
  lysp_ext_instance **local_68;
  undefined2 local_60;
  undefined4 local_58;
  uint16_t *local_50;
  undefined2 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  parent = (lysp_node *)calloc(1,0xd0);
  if (parent == (lysp_node *)0x0) {
    LVar3 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_leaflist"
          );
  }
  else {
    pplVar4 = node_meta->nodes;
    plVar2 = *pplVar4;
    if (*pplVar4 != (lysp_node *)0x0) {
      do {
        plVar5 = plVar2;
        plVar2 = plVar5->next;
      } while (plVar2 != (lysp_node *)0x0);
      pplVar4 = &plVar5->next;
    }
    *pplVar4 = parent;
    parent->nodetype = 8;
    parent->parent = node_meta->parent;
    LVar3 = lyxml_ctx_next(ctx->xmlctx);
    if ((LVar3 == LY_SUCCESS) &&
       (LVar3 = yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_IDENTIF_ARG,LY_STMT_LEAF_LIST),
       LVar3 == LY_SUCCESS)) {
      local_178.type = LY_STMT_CONFIG;
      local_178.dest = &parent->flags;
      local_178.flags = 2;
      local_160 = 0x70000;
      local_150 = 0;
      local_148 = 0x80000;
      local_140 = &parent->dsc;
      local_138 = 2;
      local_130 = 0x130000;
      local_128 = &parent->iffeatures;
      local_120 = 0;
      local_118 = 0x190000;
      local_108 = 2;
      local_100 = 0x1a0000;
      local_f0 = 2;
      local_e8 = 0x1d0000;
      local_e0 = parent + 1;
      local_d8 = 0;
      local_d0 = 0x1f0000;
      local_c0 = 2;
      local_b8 = 0x270000;
      local_b0 = &parent->ref;
      local_a8 = 2;
      local_a0 = 0x2c0000;
      local_90 = 2;
      local_88 = 0x2e0000;
      local_80 = &parent[1].next;
      local_78 = 3;
      local_70 = 0x310000;
      local_68 = &parent[2].exts;
      local_60 = 2;
      local_58 = 0x330000;
      local_50 = &parent[1].nodetype;
      local_48 = 2;
      uStack_38 = 0;
      local_30 = 0;
      local_40 = 0xf0000;
      local_158 = parent + 3;
      local_110 = parent;
      local_f8 = parent;
      local_c8 = (uint16_t *)local_178.dest;
      local_98 = (uint16_t *)local_178.dest;
      LVar3 = yin_parse_content(ctx,&local_178,0xe,parent,LY_STMT_LEAF_LIST,(char **)0x0,
                                &parent->exts);
      if ((LVar3 == LY_SUCCESS) &&
         ((object = parent->exts, object == (lysp_ext_instance *)0x0 ||
          (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0),
          LVar3 == LY_SUCCESS)))) {
        uVar1._0_2_ = parent[3].nodetype;
        uVar1._2_2_ = parent[3].flags;
        if ((uVar1 == 0) || (parent[3].parent == (lysp_node *)0x0)) {
          if (uVar1 <= *(uint *)&parent[3].field_0xc || *(uint *)&parent[3].field_0xc == 0) {
            return LY_SUCCESS;
          }
          ly_vlog((ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                  (char *)0x0,LYVE_SEMANTICS,
                  "Invalid combination of min-elements and max-elements: min value %u is bigger than the max value %u."
                 );
        }
        else {
          ly_vlog((ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                  (char *)0x0,LYVE_SYNTAX_YIN,
                  "Invalid combination of sub-elemnts \"%s\" and \"%s\" in \"%s\" element.",
                  "min-elements","default","leaf-list");
        }
        LVar3 = LY_EVALID;
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
yin_parse_leaflist(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    struct lysp_node_leaflist *llist;

    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, llist, next, LY_EMEM);

    llist->nodetype = LYS_LEAFLIST;
    llist->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &llist->name, Y_IDENTIF_ARG, LY_STMT_LEAF_LIST));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_CONFIG, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEFAULT, &llist->dflts, 0},
        {LY_STMT_DESCRIPTION, &llist->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &llist->iffeatures, 0},
        {LY_STMT_MAX_ELEMENTS, llist, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MIN_ELEMENTS, llist, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MUST, &llist->musts, 0},
        {LY_STMT_ORDERED_BY, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &llist->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &llist->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_TYPE, &llist->type, YIN_SUBELEM_UNIQUE | YIN_SUBELEM_MANDATORY},
        {LY_STMT_UNITS, &llist->units, YIN_SUBELEM_UNIQUE},
        {LY_STMT_WHEN, &llist->when, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), llist, LY_STMT_LEAF_LIST, NULL, &llist->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, llist->exts));

    /* check invalid combination of subelements */
    if ((llist->min) && (llist->dflts)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INCHILDSTMSCOMB_YIN, "min-elements", "default", "leaf-list");
        return LY_EVALID;
    }
    if (llist->max && (llist->min > llist->max)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_MINMAX, llist->min, llist->max);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}